

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint RegNo;
  uint uVar10;
  DecodeStatus DVar11;
  uint uVar12;
  uint32_t in_ESI;
  MCInst *in_RDI;
  _Bool writeback;
  uint Rt2;
  uint P;
  uint W;
  uint pred;
  uint U;
  uint imm;
  uint type;
  uint Rm;
  uint Rn;
  uint Rt;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint numBits;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar13;
  uint local_44;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  DecodeStatus local_4;
  
  local_2c[0] = MCDisassembler_Success;
  numBits = 4;
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(local_14,0x10,numBits);
  uVar4 = fieldFromInstruction_4(local_14,0,numBits);
  uVar5 = fieldFromInstruction_4(local_14,0x16,1);
  uVar6 = fieldFromInstruction_4(local_14,8,numBits);
  uVar7 = fieldFromInstruction_4(local_14,0x17,1);
  local_44 = (~uVar7 & 1) << 8;
  fieldFromInstruction_4(local_14,0x1c,numBits);
  uVar7 = fieldFromInstruction_4(local_14,0x15,1);
  uVar8 = fieldFromInstruction_4(local_14,0x18,1);
  uVar9 = uVar2 + 1;
  uVar13 = CONCAT13(uVar7 == 1 || uVar8 == 0,(int3)in_stack_ffffffffffffffa8);
  RegNo = MCInst_getOpcode(local_10);
  if (((RegNo - 0xa4 < 3) || (RegNo - 0x1af < 3)) && ((uVar2 & 1) != 0)) {
    local_2c[0] = MCDisassembler_SoftFail;
  }
  uVar10 = MCInst_getOpcode(local_10);
  if (uVar10 - 0xa4 < 3) {
    if ((uVar5 == 0) || (uVar3 != 0xf)) {
      if ((uVar8 == 0) && (uVar7 == 1)) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if ((uVar5 == 0) &&
         (((uVar9 == 0xf || (uVar4 == 0xf)) || ((uVar4 == uVar2 || (uVar4 == uVar9)))))) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if (((uVar5 == 0) && ((uVar13 & 0x1000000) != 0)) && (uVar3 == 0xf)) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if (((uVar13 & 0x1000000) != 0) && ((uVar3 == uVar2 || (uVar3 == uVar9)))) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
    }
    else if (uVar9 == 0xf) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
  }
  else if ((uVar10 == 0xab) || (uVar10 - 0xae < 2)) {
    if ((uVar5 == 0) || (uVar3 != 0xf)) {
      if (uVar2 == 0xf) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if ((uVar5 == 0) && (uVar4 == 0xf)) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if (((uVar5 == 0) && ((uVar13 & 0x1000000) != 0)) && ((uVar3 == 0xf || (uVar3 == uVar2)))) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
    }
    else if (uVar2 == 0xf) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
  }
  else if (((uVar10 == 0xb3) || (uVar10 - 0xb6 < 3)) || (uVar10 - 0xbb < 2)) {
    if ((uVar5 == 0) || (uVar3 != 0xf)) {
      if ((uVar5 != 0) && ((uVar2 == 0xf || (((uVar13 & 0x1000000) != 0 && (uVar3 == uVar2)))))) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if ((uVar5 == 0) && ((uVar2 == 0xf || (uVar4 == 0xf)))) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if (((uVar5 == 0) && ((uVar13 & 0x1000000) != 0)) && ((uVar3 == 0xf || (uVar3 == uVar2)))) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
    }
    else if (uVar2 == 0xf) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
  }
  else if (uVar10 - 0x1af < 3) {
    if ((uVar8 == 0) && (uVar7 == 1)) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
    if (((uVar13 & 0x1000000) != 0) && (((uVar3 == 0xf || (uVar3 == uVar2)) || (uVar3 == uVar9)))) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
    if ((uVar5 != 0) && (uVar4 == 0xf)) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
    if (uVar9 == 0xf) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
    if ((uVar5 == 0) && (uVar2 = fieldFromInstruction_4(local_14,8,4), uVar2 != 0)) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
  }
  else if ((uVar10 == 0x1b6) || (uVar10 - 0x1b9 < 2)) {
    if (uVar2 == 0xf) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
    if (((uVar13 & 0x1000000) != 0) && ((uVar3 == 0xf || (uVar3 == uVar2)))) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
    if ((uVar5 == 0) && (uVar4 == 0xf)) {
      local_2c[0] = MCDisassembler_SoftFail;
    }
  }
  if ((uVar13 & 0x1000000) != 0) {
    local_10->writeback = true;
    if (uVar8 == 0) {
      local_44 = local_44 | 0x400;
    }
    else {
      local_44 = local_44 | 0x200;
    }
    in_stack_ffffffffffffff94 = MCInst_getOpcode(local_10);
    if (((in_stack_ffffffffffffff94 - 0x1af < 3) || (in_stack_ffffffffffffff94 == 0x1b6)) ||
       (in_stack_ffffffffffffff94 == 0x1b9 || in_stack_ffffffffffffff94 == 0x1ba)) {
      DVar11 = DecodeGPRRegisterClass
                         ((MCInst *)CONCAT44(uVar9,uVar13),RegNo,CONCAT44(numBits,uVar10),
                          (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      _Var1 = Check(local_2c,DVar11);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
  }
  DVar11 = DecodeGPRRegisterClass
                     ((MCInst *)CONCAT44(uVar9,uVar13),RegNo,CONCAT44(numBits,uVar10),
                      (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  _Var1 = Check(local_2c,DVar11);
  if (_Var1) {
    uVar12 = MCInst_getOpcode(local_10);
    if ((uVar12 - 0xa4 < 3) || (uVar12 - 0x1af < 3)) {
      DVar11 = DecodeGPRRegisterClass
                         ((MCInst *)CONCAT44(uVar9,uVar13),RegNo,CONCAT44(numBits,uVar10),
                          (void *)CONCAT44(in_stack_ffffffffffffff94,uVar12));
      _Var1 = Check(local_2c,DVar11);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    if (((uVar13 & 0x1000000) != 0) &&
       (((in_stack_ffffffffffffff8c = MCInst_getOpcode(local_10),
         in_stack_ffffffffffffff8c - 0xa4 < 3 || (in_stack_ffffffffffffff8c == 0xab)) ||
        ((in_stack_ffffffffffffff8c - 0xad < 3 ||
         (((in_stack_ffffffffffffff8c == 0xb3 || (in_stack_ffffffffffffff8c - 0xb5 < 4)) ||
          (in_stack_ffffffffffffff8c == 0xbb || in_stack_ffffffffffffff8c == 0xbc)))))))) {
      DVar11 = DecodeGPRRegisterClass
                         ((MCInst *)CONCAT44(uVar9,uVar13),RegNo,CONCAT44(numBits,uVar10),
                          (void *)CONCAT44(in_stack_ffffffffffffff94,uVar12));
      _Var1 = Check(local_2c,DVar11);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar11 = DecodeGPRRegisterClass
                       ((MCInst *)CONCAT44(uVar9,uVar13),RegNo,CONCAT44(numBits,uVar10),
                        (void *)CONCAT44(in_stack_ffffffffffffff94,uVar12));
    _Var1 = Check(local_2c,DVar11);
    if (_Var1) {
      if (uVar5 == 0) {
        DVar11 = DecodeGPRRegisterClass
                           ((MCInst *)CONCAT44(uVar9,uVar13),RegNo,CONCAT44(numBits,uVar10),
                            (void *)CONCAT44(in_stack_ffffffffffffff94,uVar12));
        _Var1 = Check(local_2c,DVar11);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
        MCOperand_CreateImm0(local_10,(ulong)local_44);
      }
      else {
        MCOperand_CreateReg0(local_10,0);
        MCOperand_CreateImm0(local_10,(ulong)(local_44 | uVar6 << 4 | uVar4));
      }
      DVar11 = DecodePredicateOperand
                         ((MCInst *)CONCAT44(numBits,uVar10),in_stack_ffffffffffffff94,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (void *)0x28bbef);
      _Var1 = Check(local_2c,DVar11);
      if (_Var1) {
        local_4 = local_2c[0];
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned type = fieldFromInstruction_4(Insn, 22, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 8, 4);
	unsigned U = ((~fieldFromInstruction_4(Insn, 23, 1)) & 1) << 8;
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	unsigned Rt2 = Rt + 1;

	bool writeback = (W == 1) | (P == 0);

	// For {LD,ST}RD, Rt must be even, else undefined.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (Rt & 0x1) S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;

			if (writeback && (Rn == 15 || Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			if (type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (Rt2 == 15)
				S = MCDisassembler_SoftFail;
			if (!type && fieldFromInstruction_4(Insn, 8, 4))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_STRH:
		case ARM_STRH_PRE:
		case ARM_STRH_POST:
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (type && Rn == 15){
				if (Rt2 == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;
			if (!type && (Rt2 == 15 || Rm == 15 || Rm == Rt || Rm == Rt2))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && Rn == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRH:
		case ARM_LDRH_PRE:
		case ARM_LDRH_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRSH:
		case ARM_LDRSH_PRE:
		case ARM_LDRSH_POST:
		case ARM_LDRSB:
		case ARM_LDRSB_PRE:
		case ARM_LDRSB_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (type && (Rt == 15 || (writeback && Rn == Rt)))
				S = MCDisassembler_SoftFail;
			if (!type && (Rt == 15 || Rm == 15))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	if (writeback) { // Writeback
		Inst->writeback = true;
		if (P)
			U |= ARMII_IndexModePre << 9;
		else
			U |= ARMII_IndexModePost << 9;

		// On stores, the writeback operand precedes Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_STRD:
			case ARM_STRD_PRE:
			case ARM_STRD_POST:
			case ARM_STRH:
			case ARM_STRH_PRE:
			case ARM_STRH_POST:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt+1, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (writeback) {
		// On loads, the writeback operand comes after Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDRD:
			case ARM_LDRD_PRE:
			case ARM_LDRD_POST:
			case ARM_LDRH:
			case ARM_LDRH_PRE:
			case ARM_LDRH_POST:
			case ARM_LDRSH:
			case ARM_LDRSH_PRE:
			case ARM_LDRSH_POST:
			case ARM_LDRSB:
			case ARM_LDRSB_PRE:
			case ARM_LDRSB_POST:
			case ARM_LDRHTr:
			case ARM_LDRSBTr:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (type) {
		MCOperand_CreateReg0(Inst, 0);
		MCOperand_CreateImm0(Inst, U | (imm << 4) | Rm);
	} else {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateImm0(Inst, U);
	}

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}